

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite_base_test.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_5172b::Composite::~Composite(Composite *this)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer psVar2;
  
  (this->
  super_CompositeBase<(anonymous_namespace)::Base,_std::shared_ptr<(anonymous_namespace)::Base>_>).
  super_Base._vptr_Base = (_func_int **)&PTR___cxa_pure_virtual_00125878;
  psVar2 = (this->
           super_CompositeBase<(anonymous_namespace)::Base,_std::shared_ptr<(anonymous_namespace)::Base>_>
           ).m_items.
           super__Vector_base<std::shared_ptr<(anonymous_namespace)::Base>,_std::allocator<std::shared_ptr<(anonymous_namespace)::Base>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->
           super_CompositeBase<(anonymous_namespace)::Base,_std::shared_ptr<(anonymous_namespace)::Base>_>
           ).m_items.
           super__Vector_base<std::shared_ptr<(anonymous_namespace)::Base>,_std::allocator<std::shared_ptr<(anonymous_namespace)::Base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 != psVar1) {
    do {
      this_00 = (psVar2->super___shared_ptr<(anonymous_namespace)::Base,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      psVar2 = psVar2 + 1;
    } while (psVar2 != psVar1);
    psVar2 = (this->
             super_CompositeBase<(anonymous_namespace)::Base,_std::shared_ptr<(anonymous_namespace)::Base>_>
             ).m_items.
             super__Vector_base<std::shared_ptr<(anonymous_namespace)::Base>,_std::allocator<std::shared_ptr<(anonymous_namespace)::Base>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if (psVar2 != (pointer)0x0) {
    operator_delete(psVar2);
  }
  operator_delete(this);
  return;
}

Assistant:

int get() const override {
    auto sum = 0;
    for (const auto &x : m_items) {
      sum += x->get();
    }
    return sum;
  }